

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O3

TestResult ** srunner_failures(SRunner *sr)

{
  List *lp;
  int iVar1;
  int iVar2;
  TestResult **ppTVar3;
  TestResult *pTVar4;
  long lVar5;
  
  ppTVar3 = (TestResult **)emalloc(((long)sr->stats->n_errors + (long)sr->stats->n_failed) * 8);
  lp = sr->resultlst;
  check_list_front(lp);
  iVar1 = check_list_at_end(lp);
  if (iVar1 == 0) {
    iVar1 = 0;
    do {
      pTVar4 = (TestResult *)check_list_val(lp);
      if (pTVar4->rtype != CK_PASS) {
        lVar5 = (long)iVar1;
        iVar1 = iVar1 + 1;
        ppTVar3[lVar5] = pTVar4;
      }
      check_list_advance(lp);
      iVar2 = check_list_at_end(lp);
    } while (iVar2 == 0);
  }
  return ppTVar3;
}

Assistant:

TestResult **srunner_failures(SRunner * sr)
{
    int i = 0;
    TestResult **trarray;
    List *rlst;

    trarray = (TestResult **)emalloc(sizeof(trarray[0]) * srunner_ntests_failed(sr));

    rlst = sr->resultlst;
    for(check_list_front(rlst); !check_list_at_end(rlst);
        check_list_advance(rlst))
    {
        TestResult *tr = (TestResult *)check_list_val(rlst);

        if(non_pass(tr->rtype))
            trarray[i++] = tr;

    }
    return trarray;
}